

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.c
# Opt level: O0

fy_parser_state fy_parse_state_pop(fy_parser *fyp)

{
  fy_parse_state_log *_n;
  fy_parser_state state;
  fy_parse_state_log *fypsl;
  fy_parser *fyp_local;
  
  _n = fy_parse_state_log_list_pop(&fyp->state_stack);
  if (_n == (fy_parse_state_log *)0x0) {
    fyp_local._4_4_ = FYPS_NONE;
  }
  else {
    fyp_local._4_4_ = _n->state;
    fy_parse_parse_state_log_recycle(fyp,_n);
  }
  return fyp_local._4_4_;
}

Assistant:

enum fy_parser_state fy_parse_state_pop(struct fy_parser *fyp) {
    struct fy_parse_state_log *fypsl;
    enum fy_parser_state state;

    fypsl = fy_parse_state_log_list_pop(&fyp->state_stack);
    if (!fypsl)
        return FYPS_NONE;

    state = fypsl->state;

    fy_parse_parse_state_log_recycle(fyp, fypsl);

    return state;
}